

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::RecordNativeThrowMap
          (FunctionBody *this,SmallSpanSequenceIter *iter,uint32 nativeOffset,uint32 statementIndex,
          EntryPointInfo *entryPoint,uint loopNum)

{
  HeapAllocator *alloc;
  SmallSpanSequence *this_00;
  StatementData local_98;
  StatementData data;
  TrackAllocData local_60;
  SmallSpanSequence *local_38;
  SmallSpanSequence *pSpanSequence;
  LoopEntryPointInfo *pLStack_28;
  uint loopNum_local;
  EntryPointInfo *entryPoint_local;
  uint32 statementIndex_local;
  uint32 nativeOffset_local;
  SmallSpanSequenceIter *iter_local;
  FunctionBody *this_local;
  
  pSpanSequence._4_4_ = loopNum;
  pLStack_28 = (LoopEntryPointInfo *)entryPoint;
  entryPoint_local._0_4_ = statementIndex;
  entryPoint_local._4_4_ = nativeOffset;
  _statementIndex_local = iter;
  iter_local = (SmallSpanSequenceIter *)this;
  local_38 = EntryPointInfo::GetNativeThrowSpanSequence(entryPoint);
  if (local_38 == (SmallSpanSequence *)0x0) {
    if ((uint32)entryPoint_local == 0xffffffff) {
      return;
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&SmallSpanSequence::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x582);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_60);
    this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
    SmallSpanSequence::SmallSpanSequence(this_00);
    local_38 = this_00;
    if (pSpanSequence._4_4_ == 0xffffffff) {
      EntryPointInfo::SetNativeThrowSpanSequence(&pLStack_28->super_EntryPointInfo,this_00);
    }
    else {
      SetNativeThrowSpanSequence(this,this_00,pSpanSequence._4_4_,pLStack_28);
    }
  }
  else if (_statementIndex_local->accumulatedSourceBegin == (uint32)entryPoint_local) {
    return;
  }
  StatementData::StatementData(&local_98);
  local_98.sourceBegin = (uint32)entryPoint_local;
  local_98.bytecodeBegin = entryPoint_local._4_4_;
  SmallSpanSequence::RecordARange(local_38,_statementIndex_local,&local_98);
  return;
}

Assistant:

void
    FunctionBody::RecordNativeThrowMap(SmallSpanSequenceIter& iter, uint32 nativeOffset, uint32 statementIndex, EntryPointInfo* entryPoint, uint loopNum)
    {
        SmallSpanSequence *pSpanSequence;

        pSpanSequence = entryPoint->GetNativeThrowSpanSequence();

        if (!pSpanSequence)
        {
            if (statementIndex == -1)
            {
                return; // No need to initialize native throw map for non-user code
            }

            pSpanSequence = HeapNew(SmallSpanSequence);
            if (loopNum == LoopHeader::NoLoop)
            {
                ((FunctionEntryPointInfo*) entryPoint)->SetNativeThrowSpanSequence(pSpanSequence);
            }
            else
            {
                this->SetNativeThrowSpanSequence(pSpanSequence, loopNum, (LoopEntryPointInfo*) entryPoint);
            }
        }
        else if (iter.accumulatedSourceBegin == static_cast<int>(statementIndex))
        {
            return; // Compress adjacent spans which share the same statementIndex
        }

        StatementData data;
        data.sourceBegin = static_cast<int>(statementIndex); // sourceBegin represents statementIndex here
        data.bytecodeBegin = static_cast<int>(nativeOffset); // bytecodeBegin represents nativeOffset here

        pSpanSequence->RecordARange(iter, &data);
    }